

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::FinishControlTask::checkArguments
          (FinishControlTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Scope *pSVar1;
  Compilation *pCVar2;
  bool bVar3;
  long lVar4;
  
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
              );
  }
  pCVar2 = pSVar1->compilation;
  bVar3 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,0,1);
  lVar4 = 0x140;
  if (bVar3) {
    if (args->size_ == 1) {
      bVar3 = FmtHelpers::checkFinishNum(context,*args->data_);
      if (!bVar3) goto LAB_0039892c;
    }
    lVar4 = 0x138;
  }
LAB_0039892c:
  return *(Type **)((long)&(pCVar2->super_BumpAllocator).head + lVar4);
}

Assistant:

SimpleSystemTask(const std::string& name, const Type& returnType, size_t requiredArgs = 0,
                     const std::vector<const Type*>& argTypes = {}) :
        SimpleSystemSubroutine(name, SubroutineKind::Task, requiredArgs, argTypes, returnType,
                               false) {}